

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeCallsPass.h
# Opt level: O0

PreservedAnalyses * __thiscall
anon_unknown.dwarf_1e891::MergeCalls::run
          (PreservedAnalyses *__return_storage_ptr__,MergeCalls *this,Function *F,
          FunctionAnalysisManager *FM)

{
  bool bVar1;
  bool bVar2;
  reference this_00;
  Function *pFVar3;
  mapped_type *this_01;
  reference ppVar4;
  size_type sVar5;
  long *plVar6;
  FunctionPass *reg2mem;
  vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_> *CallSites;
  Function *Target;
  pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_> *KV
  ;
  iterator __end2_1;
  iterator __begin2_1;
  map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
  *__range2_1;
  Function *local_c0;
  CallBase *local_b8;
  CallInst *C;
  Instruction *I;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *BB;
  iterator __end2;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_70;
  iterator __begin2;
  Function *__range2;
  undefined1 local_58 [7];
  bool Modified;
  map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
  FuncToInvokers;
  FunctionAnalysisManager *FM_local;
  Function *F_local;
  MergeCalls *this_local;
  
  FuncToInvokers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)FM;
  std::
  map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
  ::map((map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
         *)local_58);
  bVar1 = false;
  __begin2.NodePtr = (node_pointer)F;
  local_70.NodePtr = (node_pointer)llvm::Function::begin(F);
  BB = (BasicBlock *)llvm::Function::end((Function *)__begin2.NodePtr);
  while (bVar2 = llvm::operator!=(&local_70,
                                  (ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                   *)&BB), bVar2) {
    this_00 = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
              ::operator*(&local_70);
    __end3 = llvm::BasicBlock::begin(this_00);
    I = (Instruction *)llvm::BasicBlock::end(this_00);
    while (bVar2 = llvm::operator!=(&__end3,(ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                             *)&I), bVar2) {
      C = (CallInst *)
          llvm::
          ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
          ::operator*(&__end3);
      bVar2 = llvm::isa<llvm::CallInst,llvm::Instruction>((Instruction *)C);
      if (bVar2) {
        local_b8 = &llvm::cast<llvm::CallInst,llvm::Instruction>((Instruction *)C)->super_CallBase;
        bVar2 = llvm::CallBase::isInlineAsm(local_b8);
        if ((!bVar2) &&
           (pFVar3 = llvm::CallBase::getCalledFunction(local_b8), pFVar3 != (Function *)0x0)) {
          pFVar3 = llvm::CallBase::getCalledFunction(local_b8);
          bVar2 = llvm::Function::isIntrinsic(pFVar3);
          if (!bVar2) {
            local_c0 = llvm::CallBase::getCalledFunction(local_b8);
            this_01 = std::
                      map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
                      ::operator[]((map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
                                    *)local_58,&local_c0);
            __range2_1 = (map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
                          *)local_b8;
            std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::push_back
                      (this_01,(value_type *)&__range2_1);
          }
        }
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator++(&__end3);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
    ::operator++(&local_70);
  }
  __end2_1 = std::
             map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
             ::begin((map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
                      *)local_58);
  KV = (pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>
        *)std::
          map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
          ::end((map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
                 *)local_58);
  while (bVar2 = std::operator!=(&__end2_1,(_Self *)&KV), bVar2) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>
             ::operator*(&__end2_1);
    pFVar3 = ppVar4->first;
    sVar5 = std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>::size(&ppVar4->second);
    if (1 < sVar5) {
      mergeCallSites(F,pFVar3);
      bVar1 = true;
    }
    std::
    _Rb_tree_iterator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>
    ::operator++(&__end2_1);
  }
  if (bVar1) {
    plVar6 = (long *)llvm::createDemoteRegisterToMemoryPass();
    (**(code **)(*plVar6 + 0x88))(plVar6,F);
    llvm::PreservedAnalyses::none();
  }
  else {
    llvm::PreservedAnalyses::all();
  }
  std::
  map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
  ::~map((map<llvm::Function_*,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>,_std::less<llvm::Function_*>,_std::allocator<std::pair<llvm::Function_*const,_std::vector<llvm::CallInst_*,_std::allocator<llvm::CallInst_*>_>_>_>_>
          *)local_58);
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses run(Function &F, FunctionAnalysisManager &FM) {
    std::map<Function *, std::vector<CallInst *>> FuncToInvokers;
    bool Modified = false;

    for (BasicBlock &BB : F) {
      for (Instruction &I : BB) {
        if (isa<CallInst>(I)) {
          CallInst &C = cast<CallInst>(I);
          if (C.isInlineAsm()) {
            // This is inline assembly; this can be deduplicated by a
            // different pass if necessary. It doesn't call anything.
            continue;
          }
          if (C.getCalledFunction() == nullptr) {
            // Indirect invocation (call-by-ptr). Skip for now.
            continue;
          }
          if (C.getCalledFunction()->isIntrinsic()) {
            // LLVM intrinsic - don't tamper with this!
            continue;
          }

          FuncToInvokers[C.getCalledFunction()].push_back(&C);
        }
      }
    }

    for (auto &KV : FuncToInvokers) {
      Function *Target = KV.first;
      std::vector<CallInst *> &CallSites = KV.second;
      if (CallSites.size() > 1) {
        mergeCallSites(&F, Target);
        Modified = true;
      }
    }

    // Finally, apply necessary fix-ups to stack.
    if (Modified) {
      FunctionPass *reg2mem = llvm::createDemoteRegisterToMemoryPass();
      reg2mem->runOnFunction(F);
      return llvm::PreservedAnalyses::none();
    }

    return llvm::PreservedAnalyses::all();
  }